

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed-solomon.c
# Opt level: O3

void correct_reed_solomon_debug_print(correct_reed_solomon *rs)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint i;
  ulong uVar5;
  long lVar6;
  polynomial_t poly;
  
  uVar5 = 0;
  do {
    printf("%3d  %3d    %3d  %3d\n",uVar5 & 0xffffffff,(ulong)(rs->field).exp[uVar5],
           uVar5 & 0xffffffff,(ulong)(rs->field).log[uVar5]);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x100);
  putchar(10);
  printf("roots: ");
  if (rs->min_distance != 0) {
    uVar3 = 1;
    uVar5 = 0;
    do {
      printf("%d",(ulong)rs->generator_roots[uVar5]);
      uVar4 = rs->min_distance;
      if (uVar5 < uVar4 - 1) {
        printf(", ");
        uVar4 = rs->min_distance;
      }
      uVar5 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar5 < uVar4);
  }
  puts("\n");
  printf("generator: ");
  if ((rs->generator).order != 0xffffffff) {
    uVar5 = 0;
    do {
      printf("%d*x^%d",(ulong)(rs->generator).coeff[uVar5],uVar5 & 0xffffffff);
      uVar3 = (rs->generator).order;
      if (uVar5 < uVar3) {
        printf(" + ");
        uVar3 = (rs->generator).order;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3 + 1);
  }
  puts("\n");
  printf("generator (alpha format): ");
  uVar3 = (rs->generator).order;
  uVar5 = (ulong)uVar3;
  uVar3 = uVar3 + 1;
  if (uVar3 != 0) {
    lVar6 = 0;
    do {
      printf("alpha^%d*x^%d",(ulong)(rs->field).log[(rs->generator).coeff[uVar5]],uVar5 & 0xffffffff
            );
      if ((ulong)uVar3 - 1 == lVar6) break;
      printf(" + ");
      lVar6 = lVar6 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar3 != (uint)lVar6);
  }
  puts("\n");
  printf("remainder: ");
  uVar3 = (rs->encoded_remainder).order;
  if (uVar3 != 0xffffffff) {
    bVar2 = false;
    uVar5 = 0;
    do {
      bVar1 = (rs->encoded_remainder).coeff[uVar5];
      if (bVar1 != 0) {
        if (bVar2) {
          printf(" + ");
          bVar1 = (rs->encoded_remainder).coeff[uVar5];
        }
        printf("%d*x^%d",(ulong)bVar1,uVar5 & 0xffffffff);
        uVar3 = (rs->encoded_remainder).order;
        bVar2 = true;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3 + 1);
  }
  puts("\n");
  printf("syndromes: ");
  if (rs->min_distance != 0) {
    uVar3 = 1;
    uVar5 = 0;
    do {
      printf("%d",(ulong)rs->syndromes[uVar5]);
      uVar4 = rs->min_distance;
      if (uVar5 < uVar4 - 1) {
        printf(", ");
        uVar4 = rs->min_distance;
      }
      uVar5 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar5 < uVar4);
  }
  puts("\n");
  printf("numerrors: %d\n\n",(ulong)(rs->error_locator).order);
  printf("error locator: ");
  uVar3 = (rs->error_locator).order;
  if (uVar3 != 0xffffffff) {
    bVar2 = false;
    uVar5 = 0;
    do {
      bVar1 = (rs->error_locator).coeff[uVar5];
      if (bVar1 != 0) {
        if (bVar2) {
          printf(" + ");
          bVar1 = (rs->error_locator).coeff[uVar5];
        }
        printf("%d*x^%d",(ulong)bVar1,uVar5 & 0xffffffff);
        uVar3 = (rs->error_locator).order;
        bVar2 = true;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3 + 1);
  }
  puts("\n");
  printf("error roots: ");
  uVar3 = (rs->error_locator).order;
  uVar5 = (ulong)uVar3;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      poly._8_8_ = uVar5;
      poly.coeff = (rs->error_locator).coeff;
      bVar1 = polynomial_eval(rs->field,poly,rs->error_roots[uVar4]);
      printf("%d@%d",(ulong)bVar1,(ulong)rs->error_roots[uVar4]);
      uVar3 = (rs->error_locator).order;
      if (uVar4 < uVar3 - 1) {
        printf(", ");
        uVar3 = (rs->error_locator).order;
      }
      uVar5 = (ulong)uVar3;
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar5);
  }
  puts("\n");
  printf("error evaluator: ");
  uVar3 = (rs->error_evaluator).order;
  if (uVar3 != 0) {
    bVar2 = false;
    uVar5 = 0;
    do {
      bVar1 = (rs->error_evaluator).coeff[uVar5];
      if (bVar1 != 0) {
        if (bVar2) {
          printf(" + ");
          bVar1 = (rs->error_evaluator).coeff[uVar5];
        }
        printf("%d*x^%d",(ulong)bVar1,uVar5 & 0xffffffff);
        uVar3 = (rs->error_evaluator).order;
        bVar2 = true;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3);
  }
  puts("\n");
  printf("error locator derivative: ");
  uVar3 = (rs->error_locator_derivative).order;
  if (uVar3 != 0) {
    bVar2 = false;
    uVar5 = 0;
    do {
      bVar1 = (rs->error_locator_derivative).coeff[uVar5];
      if (bVar1 != 0) {
        if (bVar2) {
          printf(" + ");
          bVar1 = (rs->error_locator_derivative).coeff[uVar5];
        }
        printf("%d*x^%d",(ulong)bVar1,uVar5 & 0xffffffff);
        uVar3 = (rs->error_locator_derivative).order;
        bVar2 = true;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3);
  }
  puts("\n");
  printf("error locator: ");
  if ((rs->error_locator).order != 0) {
    uVar5 = 0;
    do {
      printf("%d@%d",(ulong)rs->error_vals[uVar5],(ulong)rs->error_locations[uVar5]);
      uVar3 = (rs->error_locator).order;
      if (uVar5 < uVar3 - 1) {
        printf(", ");
        uVar3 = (rs->error_locator).order;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3);
  }
  puts("\n");
  return;
}

Assistant:

void correct_reed_solomon_debug_print(correct_reed_solomon *rs) {
    for (unsigned int i = 0; i < 256; i++) {
        printf("%3d  %3d    %3d  %3d\n", i, rs->field.exp[i], i, rs->field.log[i]);
    }
    printf("\n");

    printf("roots: ");
    for (unsigned int i = 0; i < rs->min_distance; i++) {
        printf("%d", rs->generator_roots[i]);
        if (i < rs->min_distance - 1) {
            printf(", ");
        }
    }
    printf("\n\n");

    printf("generator: ");
    for (unsigned int i = 0; i < rs->generator.order + 1; i++) {
        printf("%d*x^%d", rs->generator.coeff[i], i);
        if (i < rs->generator.order) {
            printf(" + ");
        }
    }
    printf("\n\n");

    printf("generator (alpha format): ");
    for (unsigned int i = rs->generator.order + 1; i > 0; i--) {
        printf("alpha^%d*x^%d", rs->field.log[rs->generator.coeff[i - 1]], i - 1);
        if (i > 1) {
            printf(" + ");
        }
    }
    printf("\n\n");

    printf("remainder: ");
    bool has_printed = false;
    for (unsigned int i = 0; i < rs->encoded_remainder.order + 1; i++) {
        if (!rs->encoded_remainder.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->encoded_remainder.coeff[i], i);
    }
    printf("\n\n");

    printf("syndromes: ");
    for (unsigned int i = 0; i < rs->min_distance; i++) {
        printf("%d", rs->syndromes[i]);
        if (i < rs->min_distance - 1) {
            printf(", ");
        }
    }
    printf("\n\n");

    printf("numerrors: %d\n\n", rs->error_locator.order);

    printf("error locator: ");
    has_printed = false;
    for (unsigned int i = 0; i < rs->error_locator.order + 1; i++) {
        if (!rs->error_locator.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->error_locator.coeff[i], i);
    }
    printf("\n\n");

    printf("error roots: ");
    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        printf("%d@%d", polynomial_eval(rs->field, rs->error_locator, rs->error_roots[i]), rs->error_roots[i]);
        if (i < rs->error_locator.order - 1) {
            printf(", ");
        }
    }
    printf("\n\n");

    printf("error evaluator: ");
    has_printed = false;
    for (unsigned int i = 0; i < rs->error_evaluator.order; i++) {
        if (!rs->error_evaluator.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->error_evaluator.coeff[i], i);
    }
    printf("\n\n");

    printf("error locator derivative: ");
    has_printed = false;
    for (unsigned int i = 0; i < rs->error_locator_derivative.order; i++) {
        if (!rs->error_locator_derivative.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->error_locator_derivative.coeff[i], i);
    }
    printf("\n\n");

    printf("error locator: ");
    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        printf("%d@%d", rs->error_vals[i], rs->error_locations[i]);
        if (i < rs->error_locator.order - 1) {
            printf(", ");
        }
    }
    printf("\n\n");
}